

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O2

bdConnection * __thiscall
bdConnectManager::findSimilarConnection(bdConnectManager *this,bdNodeId *srcId,bdNodeId *destId)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  p_Var2 = (this->mConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->mConnections)._M_t._M_impl.super__Rb_tree_header) {
      return (bdConnection *)0x0;
    }
    iVar1 = operator==((bdNodeId *)(p_Var2 + 1),srcId);
    if ((iVar1 != 0) && (iVar1 = operator==((bdNodeId *)&p_Var2[2]._M_parent,destId), iVar1 != 0))
    break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return (bdConnection *)(p_Var2 + 3);
}

Assistant:

bdConnection *bdConnectManager::findSimilarConnection(bdNodeId *srcId, bdNodeId *destId) {
	std::map<bdProxyTuple, bdConnection>::iterator it;
	for (it = mConnections.begin(); it != mConnections.end(); it++)
		if ((it->first.srcId == *srcId) && (it->first.destId == *destId))
			/* found similar connection */
			return &(it->second);
	return NULL;
}